

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction
          (ParquetKeyValueMetadataFunction *this)

{
  TableFunction *in_RDI;
  allocator_type *in_stack_ffffffffffffff08;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff10;
  initializer_list<duckdb::LogicalType> in_stack_ffffffffffffff18;
  LogicalType *local_b0;
  LogicalType local_80 [24];
  LogicalType *local_68;
  undefined8 local_60;
  undefined1 local_58 [47];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"parquet_kv_metadata",&local_29);
  duckdb::LogicalType::LogicalType(local_80,VARCHAR);
  local_68 = local_80;
  local_60 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x687f67);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff08);
  duckdb::TableFunction::TableFunction
            (in_RDI,local_28,local_58,
             ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)2>,0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x687fd3);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x687fdd);
  local_b0 = (LogicalType *)&local_68;
  do {
    local_b0 = local_b0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b0);
  } while (local_b0 != local_80);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *(undefined ***)in_RDI = &PTR__ParquetKeyValueMetadataFunction_00bff518;
  return;
}

Assistant:

ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction()
    : TableFunction("parquet_kv_metadata", {LogicalType::VARCHAR},
                    ParquetMetaDataImplementation<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataBind<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataInit<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>) {
}